

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pivotref.cpp
# Opt level: O2

bool __thiscall duckdb::PivotRef::Equals(PivotRef *this,TableRef *other_p)

{
  bool bVar1;
  int iVar2;
  PivotRef *pPVar3;
  pointer pTVar4;
  type pTVar5;
  const_reference this_00;
  const_reference other;
  idx_t i;
  ulong __n;
  
  bVar1 = TableRef::Equals(&this->super_TableRef,other_p);
  if (bVar1) {
    pPVar3 = TableRef::Cast<duckdb::PivotRef>(other_p);
    pTVar4 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator->
                       (&this->source);
    pTVar5 = unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>::operator*
                       (&pPVar3->source);
    iVar2 = (*pTVar4->_vptr_TableRef[3])(pTVar4,pTVar5);
    if ((((char)iVar2 != '\0') &&
        (bVar1 = ParsedExpression::ListEquals(&this->aggregates,&pPVar3->aggregates), bVar1)) &&
       ((long)(this->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
              .super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(this->pivots).super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
              .super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl
              .super__Vector_impl_data._M_start ==
        (long)(pPVar3->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pPVar3->pivots).
              super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
              super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>._M_impl.
              super__Vector_impl_data._M_start)) {
      __n = 0;
      do {
        if ((ulong)(((long)(this->pivots).
                           super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                           super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->pivots).
                          super_vector<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>.
                          super__Vector_base<duckdb::PivotColumn,_std::allocator<duckdb::PivotColumn>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= __n) {
          bVar1 = ::std::operator!=(&(this->unpivot_names).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ,&(pPVar3->unpivot_names).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   );
          if (bVar1) {
            return false;
          }
          bVar1 = ::std::operator!=(&(this->super_TableRef).alias,&(pPVar3->super_TableRef).alias);
          if (bVar1) {
            return false;
          }
          bVar1 = ::std::operator!=(&(this->groups).
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ,&(pPVar3->groups).
                                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   );
          if (bVar1) {
            return false;
          }
          return this->include_nulls == pPVar3->include_nulls;
        }
        this_00 = vector<duckdb::PivotColumn,_true>::get<true>(&this->pivots,__n);
        other = vector<duckdb::PivotColumn,_true>::get<true>(&pPVar3->pivots,__n);
        bVar1 = PivotColumn::Equals(this_00,other);
        __n = __n + 1;
      } while (bVar1);
    }
  }
  return false;
}

Assistant:

bool PivotRef::Equals(const TableRef &other_p) const {
	if (!TableRef::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<PivotRef>();
	if (!source->Equals(*other.source)) {
		return false;
	}
	if (!ParsedExpression::ListEquals(aggregates, other.aggregates)) {
		return false;
	}
	if (pivots.size() != other.pivots.size()) {
		return false;
	}
	for (idx_t i = 0; i < pivots.size(); i++) {
		if (!pivots[i].Equals(other.pivots[i])) {
			return false;
		}
	}
	if (unpivot_names != other.unpivot_names) {
		return false;
	}
	if (alias != other.alias) {
		return false;
	}
	if (groups != other.groups) {
		return false;
	}
	if (include_nulls != other.include_nulls) {
		return false;
	}
	return true;
}